

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O3

ssize_t __thiscall
RawFile::pread(RawFile *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  ssize_t in_RAX;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    do {
      in_RAX = ::pread(this->fd,__buf_00,(size_t)__buf,__nbytes);
      if (in_RAX < 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"RawFile::pread: pread failed");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __buf_00 = (void *)((long)__buf_00 + in_RAX);
      __nbytes = __nbytes + in_RAX;
      __buf = (void *)((long)__buf - in_RAX);
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

void RawFile::pread(void *buf, size_t to_read, off_t offset) const {
    auto *buf_raw = static_cast<char *>(buf);
    while (to_read > 0) {
        ssize_t result = ::pread(fd, buf_raw, to_read, offset);
        if (result < 0) {
            throw std::runtime_error("RawFile::pread: pread failed");
        }
        buf_raw += result;
        offset += result;
        to_read -= result;
    }
}